

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.h
# Opt level: O0

void __thiscall AcceptException::~AcceptException(AcceptException *this)

{
  AcceptException *in_RDI;
  
  ~AcceptException(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

AcceptException(std::string description) :
            description(std::move(description)) {}